

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

bool Js::ScriptFunction::GetSymbolName(Var computedNameVar,char16 **symbolName,charcount_t *length)

{
  bool bVar1;
  charcount_t cVar2;
  JavascriptSymbol *this;
  PropertyRecord *this_00;
  char16 *pcVar3;
  PropertyRecord *symbolRecord;
  charcount_t *length_local;
  char16 **symbolName_local;
  Var computedNameVar_local;
  
  if ((computedNameVar == (Var)0x0) ||
     (bVar1 = VarIs<Js::JavascriptSymbol>(computedNameVar), !bVar1)) {
    *symbolName = (char16 *)0x0;
    *length = 0;
    computedNameVar_local._7_1_ = false;
  }
  else {
    this = VarTo<Js::JavascriptSymbol>(computedNameVar);
    this_00 = JavascriptSymbol::GetValue(this);
    pcVar3 = PropertyRecord::GetBuffer(this_00);
    *symbolName = pcVar3;
    cVar2 = PropertyRecord::GetLength(this_00);
    *length = cVar2;
    computedNameVar_local._7_1_ = true;
  }
  return computedNameVar_local._7_1_;
}

Assistant:

bool ScriptFunction::GetSymbolName(Var computedNameVar, const char16** symbolName, charcount_t* length)
    {
        if (nullptr != computedNameVar && VarIs<JavascriptSymbol>(computedNameVar))
        {
            const PropertyRecord* symbolRecord = VarTo<JavascriptSymbol>(computedNameVar)->GetValue();
            *symbolName = symbolRecord->GetBuffer();
            *length = symbolRecord->GetLength();
            return true;
        }
        *symbolName = nullptr;
        *length = 0;
        return false;
    }